

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fast.c
# Opt level: O1

int main(int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  PmDeviceInfo *pPVar7;
  uint id;
  char *pcVar8;
  
  puts("Apparently this is a 64-bit machine.");
  if (argc < 2) {
    printf("Usage: test [-h] %s\nwhere %s\n%s\n%s\n%s\n",
           "[-l latency] [-r rate] [-d device] [-s dur] [-n]",
           "latency is in ms, rate is messages per second,","device is the PortMidi device number,",
           "dur is the length of the test in seconds, and",
           "-n means send timestamps in the past, -h means help.");
    bVar1 = true;
    bVar3 = true;
    bVar2 = true;
  }
  else {
    iVar6 = 1;
    bVar2 = false;
    bVar3 = false;
    bVar1 = false;
    do {
      pcVar8 = argv[iVar6];
      iVar4 = strcmp(pcVar8,"-h");
      if (iVar4 == 0) {
LAB_001029f3:
        printf("Usage: test [-h] %s\nwhere %s\n%s\n%s\n%s\n",
               "[-l latency] [-r rate] [-d device] [-s dur] [-n]",
               "latency is in ms, rate is messages per second,",
               "device is the PortMidi device number,",
               "dur is the length of the test in seconds, and",
               "-n means send timestamps in the past, -h means help.");
        iVar4 = iVar6;
      }
      else {
        iVar4 = strcmp(pcVar8,"-l");
        if ((iVar4 == 0) && (iVar4 = iVar6 + 1, iVar4 < argc)) {
          latency = atoi(argv[iVar4]);
          printf("Latency will be %ld\n",(long)latency);
          bVar2 = true;
        }
        else {
          iVar4 = strcmp(pcVar8,"-r");
          if (iVar4 == 0) {
            iVar4 = iVar6 + 1;
            msgrate = atoi(argv[(long)iVar6 + 1]);
            printf("Rate will be %d messages/second\n",(ulong)(uint)msgrate);
            bVar1 = true;
          }
          else {
            iVar4 = strcmp(pcVar8,"-s");
            if (iVar4 == 0) {
              iVar4 = iVar6 + 1;
              duration = atoi(argv[(long)iVar6 + 1]);
              printf("Duration will be %d seconds\n",(ulong)(uint)msgrate);
              bVar3 = true;
            }
            else {
              iVar4 = strcmp(pcVar8,"-n");
              if (iVar4 != 0) goto LAB_001029f3;
              puts("Sending expired timestamps (-n)");
              expired_timestamps = 1;
              iVar4 = iVar6;
            }
          }
        }
      }
      iVar6 = iVar4 + 1;
    } while (iVar6 < argc);
    bVar2 = !bVar2;
    bVar1 = !bVar1;
    bVar3 = !bVar3;
  }
  if (bVar2) {
    latency = get_number("Latency in ms: ");
  }
  if (bVar1) {
    msgrate = get_number("Rate in messages per second: ");
  }
  if (bVar3) {
    duration = get_number("Duration in seconds: ");
  }
  Pm_GetDefaultInputDeviceID();
  uVar5 = Pm_GetDefaultOutputDeviceID();
  iVar6 = Pm_CountDevices();
  if (0 < iVar6) {
    id = 0;
    do {
      pPVar7 = Pm_GetDeviceInfo(id);
      if (pPVar7->output != 0) {
        printf("%d: %s, %s",(ulong)id,pPVar7->interf,pPVar7->name);
        pcVar8 = "";
        if (uVar5 == id) {
          pcVar8 = "default ";
        }
        if (id == deviceno) {
          pcVar8 = "selected ";
        }
        printf(" (%soutput)",pcVar8);
        putchar(10);
      }
      id = id + 1;
      iVar6 = Pm_CountDevices();
    } while ((int)id < iVar6);
  }
  deviceno = get_number("Output device number: ");
  fast_test();
  return 0;
}

Assistant:

int main(int argc, char *argv[])
{
    int default_in;
    int default_out;
    int i = 0;
    int latency_valid = FALSE;
    int rate_valid = FALSE;
    int device_valid = FALSE;
    int dur_valid = FALSE;
    
    if (sizeof(void *) == 8) 
        printf("Apparently this is a 64-bit machine.\n");
    else if (sizeof(void *) == 4) 
        printf ("Apparently this is a 32-bit machine.\n");
    
    if (argc <= 1) {
        show_usage();
    } else {
        for (i = 1; i < argc; i++) {
            if (strcmp(argv[i], "-h") == 0) {
                show_usage();
            } else if (strcmp(argv[i], "-l") == 0 && (i + 1 < argc)) {
                i = i + 1;
                latency = atoi(argv[i]);
                printf("Latency will be %ld\n", (long) latency);
                latency_valid = TRUE;
            } else if (strcmp(argv[i], "-r") == 0) {
                i = i + 1;
                msgrate = atoi(argv[i]);
                printf("Rate will be %d messages/second\n", msgrate);
                rate_valid = TRUE;
            } else if (strcmp(argv[i], "-s") == 0) {
                i = i + 1;
                duration = atoi(argv[i]);
                printf("Duration will be %d seconds\n", msgrate);
                dur_valid = TRUE;
            } else if (strcmp(argv[i], "-n") == 0) {
                printf("Sending expired timestamps (-n)\n");
                expired_timestamps = TRUE;
            } else {
                show_usage();
            }
        }
    }

    if (!latency_valid) {
        // coerce to known size
        latency = (int32_t) get_number("Latency in ms: "); 
    }

    if (!rate_valid) {
        // coerce from "%d" to known size
        msgrate = (int32_t) get_number("Rate in messages per second: ");
    }

    if (!dur_valid) {
        duration = get_number("Duration in seconds: ");
    }

    /* list device information */
    default_in = Pm_GetDefaultInputDeviceID();
    default_out = Pm_GetDefaultOutputDeviceID();
    for (i = 0; i < Pm_CountDevices(); i++) {
        char *deflt;
        const PmDeviceInfo *info = Pm_GetDeviceInfo(i);
        if (info->output) {
            printf("%d: %s, %s", i, info->interf, info->name);
            deflt = (i == deviceno ? "selected " :
                      (i == default_out ? "default " : ""));
            printf(" (%soutput)", deflt);
            printf("\n");
        }
    }
    
    if (!device_valid) {
        deviceno = get_number("Output device number: ");
    }

    fast_test();
    return 0;
}